

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c7e9::BlockCopy<sptk::int24_t>::BlockCopy
          (BlockCopy<sptk::int24_t> *this,int input_start_number,int input_end_number,
          int input_block_length,int output_start_number,int output_block_length,double pad_value,
          bool is_ascii)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  BlockCopyInterface *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  byte in_stack_00000008;
  int24_t *in_stack_ffffffffffffffc0;
  
  BlockCopyInterface::BlockCopyInterface(in_RDI);
  in_RDI->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopy_00138a30;
  *(undefined4 *)&in_RDI[1]._vptr_BlockCopyInterface = in_ESI;
  *(undefined4 *)((long)&in_RDI[1]._vptr_BlockCopyInterface + 4) = in_EDX;
  *(undefined4 *)&in_RDI[2]._vptr_BlockCopyInterface = in_ECX;
  *(undefined4 *)((long)&in_RDI[2]._vptr_BlockCopyInterface + 4) = in_R8D;
  *(undefined4 *)&in_RDI[3]._vptr_BlockCopyInterface = in_R9D;
  sptk::int24_t::int24_t<double>(in_stack_ffffffffffffffc0,(double)in_RDI);
  *(byte *)((long)&in_RDI[3]._vptr_BlockCopyInterface + 7) = in_stack_00000008 & 1;
  return;
}

Assistant:

BlockCopy(int input_start_number, int input_end_number,
            int input_block_length, int output_start_number,
            int output_block_length, double pad_value, bool is_ascii = false)
      : input_start_number_(input_start_number),
        input_end_number_(input_end_number),
        input_block_length_(input_block_length),
        output_start_number_(output_start_number),
        output_block_length_(output_block_length),
        pad_value_(static_cast<T>(pad_value)),
        is_ascii_(is_ascii) {
  }